

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O2

void crnlib::utils::endian_swap_mem(void *p,uint size_in_bytes,uint type_size)

{
  if (type_size == 8) {
    endian_swap_mem64((uint64 *)p,size_in_bytes >> 3);
    return;
  }
  if (type_size != 4) {
    if (type_size == 2) {
      endian_swap_mem16((uint16 *)p,size_in_bytes >> 1);
      return;
    }
    return;
  }
  endian_swap_mem32((uint32 *)p,size_in_bytes >> 2);
  return;
}

Assistant:

inline void endian_swap_mem(void* p, uint size_in_bytes, uint type_size) {
            switch (type_size)
            {
            case sizeof(uint16) :
                endian_swap_mem16(static_cast<uint16*>(p), size_in_bytes / type_size);
                break;
            case sizeof(uint32) :
                endian_swap_mem32(static_cast<uint32*>(p), size_in_bytes / type_size);
                break;
            case sizeof(uint64) :
                endian_swap_mem64(static_cast<uint64*>(p), size_in_bytes / type_size);
                break;
            }
        }